

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLDriver.cpp
# Opt level: O0

void __thiscall
irr::video::COpenGLDriver::draw2DImage(COpenGLDriver *this,ITexture *texture,u32 layer,bool flip)

{
  bool bVar1;
  E_TEXTURE_TYPE EVar2;
  undefined8 *puVar3;
  byte in_CL;
  int iVar4;
  uint in_EDX;
  ITexture *in_RSI;
  COpenGLCacheHandler *in_RDI;
  vector2df texcoordData_1 [4];
  f32 modificator;
  vector3df texcoordData [4];
  vector3df texcoordCubeData [6] [4];
  vector3df positionData [4];
  GLenum in_stack_fffffffffffffe2c;
  undefined1 local_1c8 [4];
  float in_stack_fffffffffffffe3c;
  vector2d<float> in_stack_fffffffffffffe40;
  vector2d<float> vStack_1b8;
  vector2d<float> avStack_1b0 [2];
  float local_19c;
  undefined8 local_198;
  undefined4 local_190;
  undefined8 local_18c;
  undefined4 local_184;
  undefined8 local_180;
  undefined4 local_178;
  undefined8 local_174;
  undefined4 local_16c;
  undefined8 local_168 [2];
  ESetTextureActive in_stack_fffffffffffffeac;
  ITexture *in_stack_fffffffffffffeb0;
  u32 in_stack_fffffffffffffebc;
  STextureCache *in_stack_fffffffffffffec0;
  undefined1 in_stack_ffffffffffffff4d;
  undefined1 in_stack_ffffffffffffff4e;
  undefined1 in_stack_ffffffffffffff4f;
  COpenGLDriver *in_stack_ffffffffffffff50;
  undefined1 local_48 [51];
  byte local_15;
  uint local_14;
  ITexture *local_10;
  
  local_15 = in_CL & 1;
  if (in_RSI != (ITexture *)0x0) {
    local_14 = in_EDX;
    local_10 = in_RSI;
    COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
    ::getTextureCache(*(COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                        **)&in_RDI[0xe].
                            super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                            .TextureCache.DriverType);
    bVar1 = COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
            ::STextureCache::set
                      (in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,in_stack_fffffffffffffeb0
                       ,in_stack_fffffffffffffeac);
    if (bVar1) {
      disableTextures((COpenGLDriver *)in_stack_fffffffffffffe40,(u32)in_stack_fffffffffffffe3c);
      setRenderStates2DMode
                (in_stack_ffffffffffffff50,(bool)in_stack_ffffffffffffff4f,
                 (bool)in_stack_ffffffffffffff4e,(bool)in_stack_ffffffffffffff4d);
      COpenGLCacheHandler::setMatrixMode(in_RDI,in_stack_fffffffffffffe2c);
      glLoadIdentity();
      COpenGLCacheHandler::setMatrixMode(in_RDI,in_stack_fffffffffffffe2c);
      glLoadIdentity();
      *(undefined1 *)
       ((long)&in_RDI[0x10].
               super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
               .BlendDestinationAlpha + 5) = 1;
      COpenGLCacheHandler::setClientState
                (in_RDI,SUB41(in_stack_fffffffffffffe2c >> 0x18,0),
                 SUB41(in_stack_fffffffffffffe2c >> 0x10,0),SUB41(in_stack_fffffffffffffe2c >> 8,0),
                 SUB41(in_stack_fffffffffffffe2c,0));
      memcpy(local_48,&DAT_003df31c,0x30);
      glVertexPointer(2,0x1406,0xc,local_48);
      if ((local_10 == (ITexture *)0x0) ||
         (EVar2 = ITexture::getType(local_10), EVar2 != ETT_CUBEMAP)) {
        local_19c = 1.0;
        if ((local_15 & 1) == 0) {
          local_19c = 0.0;
        }
        core::vector2d<float>::vector2d((vector2d<float> *)local_1c8,0.0,local_19c + 0.0);
        core::vector2d<float>::vector2d
                  ((vector2d<float> *)&stack0xfffffffffffffe40,1.0,local_19c + 0.0);
        core::vector2d<float>::vector2d(&vStack_1b8,1.0,1.0 - local_19c);
        core::vector2d<float>::vector2d(avStack_1b0,0.0,1.0 - local_19c);
        glTexCoordPointer(2,0x1406,8,local_1c8);
      }
      else {
        memcpy(local_168,&DAT_003df34c,0x120);
        iVar4 = 0;
        if ((local_15 & 1) != 0) {
          iVar4 = 3;
        }
        puVar3 = (undefined8 *)((long)local_168 + (long)iVar4 * 0xc + (ulong)local_14 * 0x30);
        local_198 = *puVar3;
        local_190 = *(undefined4 *)(puVar3 + 1);
        iVar4 = 1;
        if ((local_15 & 1) != 0) {
          iVar4 = 2;
        }
        puVar3 = (undefined8 *)((long)local_168 + (long)iVar4 * 0xc + (ulong)local_14 * 0x30);
        local_18c = *puVar3;
        local_184 = *(undefined4 *)(puVar3 + 1);
        iVar4 = 2;
        if ((local_15 & 1) != 0) {
          iVar4 = 1;
        }
        puVar3 = (undefined8 *)((long)local_168 + (long)iVar4 * 0xc + (ulong)local_14 * 0x30);
        local_180 = *puVar3;
        local_178 = *(undefined4 *)(puVar3 + 1);
        iVar4 = 3;
        if ((local_15 & 1) != 0) {
          iVar4 = 0;
        }
        puVar3 = (undefined8 *)((long)local_168 + (long)iVar4 * 0xc + (ulong)local_14 * 0x30);
        local_174 = *puVar3;
        local_16c = *(undefined4 *)(puVar3 + 1);
        glTexCoordPointer(3,0x1406,0xc,&local_198);
      }
      glDrawElements(6,4,0x1403,&Quad2DIndices);
    }
  }
  return;
}

Assistant:

void COpenGLDriver::draw2DImage(const video::ITexture *texture, u32 layer, bool flip)
{
	if (!texture || !CacheHandler->getTextureCache().set(0, texture))
		return;

	disableTextures(1);

	setRenderStates2DMode(false, true, true);

	CacheHandler->setMatrixMode(GL_PROJECTION);
	glLoadIdentity();
	CacheHandler->setMatrixMode(GL_MODELVIEW);
	glLoadIdentity();

	Transformation3DChanged = true;

	CacheHandler->setClientState(true, false, false, true);

	const core::vector3df positionData[4] = {
			core::vector3df(-1.f, 1.f, 0.f),
			core::vector3df(1.f, 1.f, 0.f),
			core::vector3df(1.f, -1.f, 0.f),
			core::vector3df(-1.f, -1.f, 0.f)};

	glVertexPointer(2, GL_FLOAT, sizeof(core::vector3df), positionData);

	if (texture && texture->getType() == ETT_CUBEMAP) {
		const core::vector3df texcoordCubeData[6][4] = {

				// GL_TEXTURE_CUBE_MAP_POSITIVE_X
				{
						core::vector3df(1.f, 1.f, 1.f),
						core::vector3df(1.f, 1.f, -1.f),
						core::vector3df(1.f, -1.f, -1.f),
						core::vector3df(1.f, -1.f, 1.f)},

				// GL_TEXTURE_CUBE_MAP_NEGATIVE_X
				{
						core::vector3df(-1.f, 1.f, -1.f),
						core::vector3df(-1.f, 1.f, 1.f),
						core::vector3df(-1.f, -1.f, 1.f),
						core::vector3df(-1.f, -1.f, -1.f)},

				// GL_TEXTURE_CUBE_MAP_POSITIVE_Y
				{
						core::vector3df(-1.f, 1.f, -1.f),
						core::vector3df(1.f, 1.f, -1.f),
						core::vector3df(1.f, 1.f, 1.f),
						core::vector3df(-1.f, 1.f, 1.f)},

				// GL_TEXTURE_CUBE_MAP_NEGATIVE_Y
				{
						core::vector3df(-1.f, -1.f, 1.f),
						core::vector3df(-1.f, -1.f, -1.f),
						core::vector3df(1.f, -1.f, -1.f),
						core::vector3df(1.f, -1.f, 1.f)},

				// GL_TEXTURE_CUBE_MAP_POSITIVE_Z
				{
						core::vector3df(-1.f, 1.f, 1.f),
						core::vector3df(-1.f, -1.f, 1.f),
						core::vector3df(1.f, -1.f, 1.f),
						core::vector3df(1.f, 1.f, 1.f)},

				// GL_TEXTURE_CUBE_MAP_NEGATIVE_Z
				{
						core::vector3df(1.f, 1.f, -1.f),
						core::vector3df(-1.f, 1.f, -1.f),
						core::vector3df(-1.f, -1.f, -1.f),
						core::vector3df(1.f, -1.f, -1.f)}};

		const core::vector3df texcoordData[4] = {
				texcoordCubeData[layer][(flip) ? 3 : 0],
				texcoordCubeData[layer][(flip) ? 2 : 1],
				texcoordCubeData[layer][(flip) ? 1 : 2],
				texcoordCubeData[layer][(flip) ? 0 : 3]};

		glTexCoordPointer(3, GL_FLOAT, sizeof(core::vector3df), texcoordData);
	} else {
		f32 modificator = (flip) ? 1.f : 0.f;

		core::vector2df texcoordData[4] = {
				core::vector2df(0.f, 0.f + modificator),
				core::vector2df(1.f, 0.f + modificator),
				core::vector2df(1.f, 1.f - modificator),
				core::vector2df(0.f, 1.f - modificator)};

		glTexCoordPointer(2, GL_FLOAT, sizeof(core::vector2df), texcoordData);
	}

	glDrawElements(GL_TRIANGLE_FAN, 4, GL_UNSIGNED_SHORT, Quad2DIndices);
}